

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::alphaHullInstruction
          (SelectionEvaluator *this,Token *instruction,int frame)

{
  bool bVar1;
  int iVar2;
  allocator<char> *in_RSI;
  SelectionSet *in_RDI;
  RealType RVar3;
  float alpha;
  any alphaSpec;
  SelectionSet bs;
  string *in_stack_ffffffffffffff28;
  SelectionEvaluator *in_stack_ffffffffffffff30;
  any *in_stack_ffffffffffffff38;
  any *in_stack_ffffffffffffff40;
  SelectionEvaluator *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  HullFinder *in_stack_ffffffffffffff78;
  allocator<char> local_79;
  string local_78 [32];
  float local_58;
  
  createSelectionSets(in_stack_ffffffffffffff68);
  std::any::any(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_58 = 0.0;
  std::any::type(in_stack_ffffffffffffff38);
  bVar1 = std::type_info::operator==
                    ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38);
  if (bVar1) {
    local_58 = std::any_cast<float>((any *)in_stack_ffffffffffffff30);
  }
  else {
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    if (bVar1) {
      iVar2 = std::any_cast<int>((any *)in_stack_ffffffffffffff30);
      local_58 = (float)iVar2;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (char *)in_stack_ffffffffffffff68,in_RSI);
      evalError(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator(&local_79);
      SelectionSet::clearAll((SelectionSet *)in_stack_ffffffffffffff30);
    }
  }
  AlphaHullFinder::setAlpha((AlphaHullFinder *)(in_RSI + 0x3d0),(double)local_58);
  HullFinder::findHull(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  SelectionSet::operator=
            ((SelectionSet *)&stack0xffffffffffffff68,(SelectionSet *)in_stack_ffffffffffffff28);
  SelectionSet::~SelectionSet((SelectionSet *)0x3cb95e);
  RVar3 = HullFinder::getSurfaceArea((HullFinder *)(in_RSI + 0x3d0));
  *(RealType *)(in_RSI + 0x538) = RVar3;
  in_RSI[0x532] = (allocator<char>)0x1;
  RVar3 = HullFinder::getVolume((HullFinder *)(in_RSI + 0x3d0));
  *(RealType *)(in_RSI + 0x548) = RVar3;
  in_RSI[0x540] = (allocator<char>)0x1;
  SelectionSet::parallelReduce((SelectionSet *)in_stack_ffffffffffffff78);
  std::any::~any((any *)0x3cb9de);
  SelectionSet::~SelectionSet((SelectionSet *)0x3cb9eb);
  return in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::alphaHullInstruction(
      const Token& instruction, int frame) {
    SelectionSet bs = createSelectionSets();

    std::any alphaSpec = instruction.value;
    float alpha(0.0);
    if (alphaSpec.type() == typeid(float)) {
      alpha = std::any_cast<float>(alphaSpec);
    } else if (alphaSpec.type() == typeid(int)) {
      alpha = std::any_cast<int>(alphaSpec);
    } else {
      evalError("casting error in alphaHullInstruction");
      bs.clearAll();
    }

    alphaHullFinder.setAlpha(alpha);
    bs              = alphaHullFinder.findHull(frame);
    surfaceArea_    = alphaHullFinder.getSurfaceArea();
    hasSurfaceArea_ = true;
    volume_         = alphaHullFinder.getVolume();
    hasVolume_      = true;

    return bs.parallelReduce();
  }